

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O3

void __thiscall
CCIT<UFPC>::PerformLabelingMem
          (CCIT<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer piVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  int *piVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  uint j;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  long lVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  double dVar45;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  ulong local_338;
  long local_308;
  long local_2c8;
  undefined1 local_2b8 [104];
  Mat local_250 [16];
  long local_240;
  long *local_208;
  long local_1f0;
  CCIT<UFPC> *local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  long lVar39;
  
  local_1e0 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar1;
  local_110.width = (int)((ulong)uVar1 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2b8,&local_110,0);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::MemAlloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  piVar9 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar8 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0xc;
  lVar42 = (long)iVar3;
  uVar4 = *(uint *)&pMVar5->field_0x8;
  uVar20 = (ulong)uVar4;
  if (0 < lVar42) {
    iVar37 = 0;
    do {
      lVar30 = (long)iVar37;
      piVar19 = (int *)(local_160 + lVar30 * 4);
      *piVar19 = *piVar19 + 1;
      uVar21 = UFPC::length_;
      if (*(char *)(local_1d8._24_8_ + lVar30) == '\0') {
        iVar18 = iVar37 + 1;
        if ((iVar18 < iVar3) &&
           (piVar19 = (int *)(local_160 + 4 + lVar30 * 4), *piVar19 = *piVar19 + 1,
           *(char *)(local_1d8._24_8_ + 1 + lVar30) != '\0')) {
LAB_001d43b0:
          uVar21 = UFPC::length_;
          lVar13 = (long)(int)UFPC::length_;
          piVar9[lVar13] = piVar9[lVar13] + 1;
          puVar8[lVar13] = uVar21;
          uVar21 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
          piVar19 = (int *)(local_240 + lVar30 * 4);
          *piVar19 = *piVar19 + 1;
          *(uint *)(local_2b8._24_8_ + lVar30 * 4) = uVar21;
          goto LAB_001d43d6;
        }
        if (1 < (int)uVar4) {
          lVar13 = *local_128 + local_160;
          piVar19 = (int *)(lVar13 + lVar30 * 4);
          *piVar19 = *piVar19 + 1;
          uVar21 = UFPC::length_;
          lVar15 = *(long *)local_1d8._80_8_ + local_1d8._24_8_;
          if (*(char *)(lVar30 + lVar15) == '\0') {
            if ((iVar18 < iVar3) &&
               (piVar19 = (int *)(lVar13 + 4 + lVar30 * 4), *piVar19 = *piVar19 + 1,
               *(char *)(lVar15 + 1 + lVar30) != '\0')) goto LAB_001d43b0;
          }
          else {
            lVar24 = (long)(int)UFPC::length_;
            piVar9[lVar24] = piVar9[lVar24] + 1;
            puVar8[lVar24] = uVar21;
            uVar21 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
            piVar19 = (int *)(local_240 + lVar30 * 4);
            *piVar19 = *piVar19 + 1;
            *(uint *)(local_2b8._24_8_ + lVar30 * 4) = uVar21;
            if (iVar18 < iVar3) {
              piVar19 = (int *)(lVar13 + 4 + lVar30 * 4);
              *piVar19 = *piVar19 + 1;
              cVar2 = *(char *)(lVar15 + 1 + lVar30);
              goto joined_r0x001d45c5;
            }
          }
        }
LAB_001d4600:
        iVar18 = iVar37 + 2;
      }
      else {
        lVar13 = (long)(int)UFPC::length_;
        piVar9[lVar13] = piVar9[lVar13] + 1;
        puVar8[lVar13] = uVar21;
        uVar21 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        piVar19 = (int *)(local_240 + lVar30 * 4);
        *piVar19 = *piVar19 + 1;
        *(uint *)(local_2b8._24_8_ + lVar30 * 4) = uVar21;
        if (iVar3 <= iVar37 + 1) goto LAB_001d4600;
        piVar19 = (int *)(local_160 + 4 + lVar30 * 4);
        *piVar19 = *piVar19 + 1;
        if (*(char *)(local_1d8._24_8_ + 1 + lVar30) == '\0') {
          if (1 < (int)uVar4) {
            piVar19 = (int *)(*local_128 + local_160 + 4 + lVar30 * 4);
            *piVar19 = *piVar19 + 1;
            cVar2 = *(char *)(lVar30 + 1 + *(long *)local_1d8._80_8_ + local_1d8._24_8_);
joined_r0x001d45c5:
            if (cVar2 != '\0') goto LAB_001d43d6;
          }
          goto LAB_001d4600;
        }
LAB_001d43d6:
        iVar18 = iVar37 + 2;
        if (iVar18 < iVar3) {
          lVar27 = (long)iVar18;
          lVar15 = local_240 + lVar27 * 4;
          lVar31 = lVar27 * 4 + local_2b8._24_8_;
          lVar30 = local_160 + lVar27 * 4;
          lVar13 = local_1d8._24_8_ + lVar27;
          lVar24 = 0;
          do {
            piVar19 = (int *)(lVar30 + lVar24 * 4);
            *piVar19 = *piVar19 + 1;
            iVar12 = (int)lVar24;
            if (*(char *)(lVar13 + lVar24) == '\0') {
              iVar11 = iVar37 + 3 + iVar12;
              if ((iVar11 < iVar3) &&
                 (piVar19 = (int *)(local_160 + (long)iVar11 * 4), *piVar19 = *piVar19 + 1,
                 *(char *)(local_1d8._24_8_ + (long)iVar11) != '\0')) {
                if (((int)uVar4 < 2) ||
                   (piVar19 = (int *)(*local_128 + lVar30 + lVar24 * 4), *piVar19 = *piVar19 + 1,
                   *(char *)(lVar24 + *(long *)local_1d8._80_8_ + lVar13) == '\0')) {
LAB_001d4523:
                  uVar21 = UFPC::length_;
                  lVar39 = (long)(int)UFPC::length_;
                  piVar9[lVar39] = piVar9[lVar39] + 1;
                  puVar8[lVar39] = uVar21;
                  uVar21 = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                }
                piVar19 = (int *)(lVar15 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(lVar31 + lVar24 * 4) = uVar21;
                goto LAB_001d454c;
              }
              if (1 < (int)uVar4) {
                lVar39 = local_160 + *local_128;
                piVar19 = (int *)(*local_128 + lVar30 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                lVar22 = local_1d8._24_8_ + *(long *)local_1d8._80_8_;
                if (*(char *)(lVar24 + *(long *)local_1d8._80_8_ + lVar13) == '\0') {
                  if ((iVar11 < iVar3) &&
                     (piVar19 = (int *)(lVar39 + (long)iVar11 * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar22 + iVar11) != '\0')) goto LAB_001d4523;
                }
                else {
                  piVar19 = (int *)(lVar15 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar31 + lVar24 * 4) = uVar21;
                  if (iVar11 < iVar3) {
                    piVar19 = (int *)(lVar39 + (long)iVar11 * 4);
                    *piVar19 = *piVar19 + 1;
                    cVar2 = *(char *)(lVar22 + iVar11);
                    goto joined_r0x001d4464;
                  }
                }
              }
LAB_001d45cd:
              iVar18 = iVar18 + iVar12 + 2;
              goto LAB_001d4607;
            }
            piVar19 = (int *)(lVar15 + lVar24 * 4);
            *piVar19 = *piVar19 + 1;
            *(uint *)(lVar31 + lVar24 * 4) = uVar21;
            iVar11 = iVar37 + 3 + iVar12;
            if (iVar3 <= iVar11) goto LAB_001d45cd;
            lVar39 = (long)iVar11;
            piVar19 = (int *)(local_160 + lVar39 * 4);
            *piVar19 = *piVar19 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar39) == '\0') {
              if (1 < (int)uVar4) {
                piVar19 = (int *)(*local_128 + local_160 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                cVar2 = *(char *)(lVar39 + *(long *)local_1d8._80_8_ + local_1d8._24_8_);
joined_r0x001d4464:
                if (cVar2 != '\0') goto LAB_001d454c;
              }
              goto LAB_001d45cd;
            }
LAB_001d454c:
            lVar39 = lVar27 + lVar24;
            lVar24 = lVar24 + 2;
          } while (lVar39 + 2 < lVar42);
          iVar18 = iVar18 + (int)lVar24;
        }
      }
LAB_001d4607:
      iVar37 = iVar18;
    } while (iVar37 < iVar3);
  }
  local_1e8 = this;
  if (2 < (int)uVar4) {
    uVar33 = 2;
    local_1f0 = 3;
    local_2c8 = 1;
    local_308 = 0;
    do {
      if (0 < iVar3) {
        lVar30 = uVar33 - 1;
        lVar13 = uVar33 - 2;
        uVar14 = uVar33 | 1;
        uVar38 = 0;
        do {
          lVar15 = *local_128;
          lVar27 = lVar15 * uVar33 + local_160;
          iVar37 = (int)uVar38;
          lVar39 = (long)iVar37;
          piVar19 = (int *)(lVar27 + lVar39 * 4);
          *piVar19 = *piVar19 + 1;
          lVar24 = *(long *)local_1d8._80_8_;
          lVar31 = lVar24 * uVar33 + local_1d8._24_8_;
          uVar21 = iVar37 + 1;
          if (*(char *)(lVar39 + lVar31) == '\0') {
            if (((int)uVar21 < iVar3) &&
               (piVar19 = (int *)(lVar27 + 4 + lVar39 * 4), *piVar19 = *piVar19 + 1,
               *(char *)(lVar31 + 1 + lVar39) != '\0')) {
              lVar27 = local_160 + lVar15 * lVar30;
              piVar19 = (int *)(lVar27 + 4 + lVar39 * 4);
              *piVar19 = *piVar19 + 1;
              lVar15 = local_1d8._24_8_ + lVar24 * lVar30;
              if (*(char *)(lVar39 + 1 + lVar15) == '\0') {
                piVar19 = (int *)(lVar27 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                if (*(char *)(lVar15 + lVar39) != '\0') {
                  lVar24 = *local_208;
                  lVar22 = lVar24 * lVar13 + local_240;
                  piVar19 = (int *)(lVar22 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar31 = *(long *)local_2b8._80_8_;
                  lVar25 = lVar31 * lVar13 + local_2b8._24_8_;
                  uVar23 = *(uint *)(lVar25 + lVar39 * 4);
                  piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar31 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                  goto LAB_001d4cd5;
                }
                if ((iVar37 + 2 < iVar3) &&
                   (piVar19 = (int *)(lVar27 + 8 + lVar39 * 4), *piVar19 = *piVar19 + 1,
                   *(char *)(lVar15 + 2 + lVar39) != '\0')) {
                  lVar15 = *local_208;
                  piVar19 = (int *)(lVar15 * lVar13 + local_240 + 8 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar24 = *(long *)local_2b8._80_8_;
                  uVar23 = *(uint *)(lVar24 * lVar13 + local_2b8._24_8_ + 8 + lVar39 * 4);
                  goto LAB_001d4e7e;
                }
LAB_001d4eb6:
                uVar21 = UFPC::length_;
                lVar15 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar15] = uVar21;
                uVar23 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(*(long *)local_2b8._80_8_ * uVar33 + local_2b8._24_8_ + lVar39 * 4) =
                     uVar23;
              }
              else {
                lVar15 = *local_208;
                piVar19 = (int *)(lVar15 * lVar13 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                lVar24 = *(long *)local_2b8._80_8_;
                uVar23 = *(uint *)(lVar24 * lVar13 + local_2b8._24_8_ + lVar39 * 4);
                piVar19 = (int *)(lVar15 * uVar33 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(lVar24 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
              }
LAB_001d4eff:
              bVar44 = true;
              goto LAB_001d4f01;
            }
            if (uVar14 < uVar20) {
              lVar27 = local_160 + lVar15 * uVar14;
              piVar19 = (int *)(lVar27 + lVar39 * 4);
              *piVar19 = *piVar19 + 1;
              uVar23 = UFPC::length_;
              lVar15 = local_1d8._24_8_ + lVar24 * uVar14;
              if (*(char *)(lVar39 + lVar15) == '\0') {
                if (((int)uVar21 < iVar3) &&
                   (piVar19 = (int *)(lVar27 + 4 + lVar39 * 4), *piVar19 = *piVar19 + 1,
                   uVar21 = UFPC::length_, *(char *)(lVar15 + 1 + lVar39) != '\0')) {
                  lVar15 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar15] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar15] = uVar21;
                  uVar23 = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(*(long *)local_2b8._80_8_ * uVar33 + local_2b8._24_8_ + lVar39 * 4) =
                       uVar23;
                  goto LAB_001d4eff;
                }
              }
              else {
                lVar24 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar24] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar24] = uVar23;
                uVar23 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(*(long *)local_2b8._80_8_ * uVar33 + local_2b8._24_8_ + lVar39 * 4) =
                     uVar23;
                if ((int)uVar21 < iVar3) {
                  piVar19 = (int *)(lVar27 + 4 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  bVar44 = true;
                  if (*(char *)(lVar15 + 1 + lVar39) != '\0') goto LAB_001d4f01;
                }
              }
            }
LAB_001d4c54:
            uVar41 = (ulong)(iVar37 + 2);
          }
          else {
            if (((int)uVar21 < iVar3) &&
               (piVar19 = (int *)(lVar27 + 4 + lVar39 * 4), *piVar19 = *piVar19 + 1,
               *(char *)(lVar31 + 1 + lVar39) != '\0')) {
              lVar27 = local_160 + lVar15 * lVar30;
              piVar19 = (int *)(lVar27 + lVar39 * 4);
              *piVar19 = *piVar19 + 1;
              lVar15 = local_1d8._24_8_ + lVar24 * lVar30;
              if (*(char *)(lVar39 + lVar15) == '\0') {
                piVar19 = (int *)(lVar27 + 4 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                if (*(char *)(lVar15 + 1 + lVar39) == '\0') {
                  if ((iVar37 < 2) ||
                     (piVar19 = (int *)(lVar27 + (ulong)(iVar37 - 1) * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar15 + (ulong)(iVar37 - 1)) == '\0')) {
                    if ((iVar3 <= iVar37 + 2) ||
                       (piVar19 = (int *)(lVar27 + 8 + lVar39 * 4), *piVar19 = *piVar19 + 1,
                       *(char *)(lVar15 + 2 + lVar39) == '\0')) goto LAB_001d4eb6;
                    lVar15 = *local_208;
                    piVar19 = (int *)(lVar15 * lVar13 + local_240 + 8 + lVar39 * 4);
                    *piVar19 = *piVar19 + 1;
                    lVar24 = *(long *)local_2b8._80_8_;
                    uVar23 = *(uint *)(lVar24 * lVar13 + local_2b8._24_8_ + 8 + lVar39 * 4);
LAB_001d4e7e:
                    piVar19 = (int *)(lVar15 * uVar33 + local_240 + lVar39 * 4);
                    *piVar19 = *piVar19 + 1;
                    *(uint *)(lVar24 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                    goto LAB_001d4eff;
                  }
                  lVar24 = *local_208;
                  lVar22 = lVar24 * lVar13 + local_240;
                  piVar19 = (int *)(lVar22 + (ulong)(iVar37 - 2) * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar31 = *(long *)local_2b8._80_8_;
                  lVar25 = lVar31 * lVar13 + local_2b8._24_8_;
                  uVar23 = *(uint *)(lVar25 + (ulong)(iVar37 - 2) * 4);
                  piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar31 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                  if (iVar37 + 2 < iVar3) {
                    uVar41 = uVar38 & 0xffffffff;
                    piVar19 = (int *)(lVar27 + 8 + uVar41 * 4);
                    *piVar19 = *piVar19 + 1;
                    if (*(char *)(lVar15 + 2 + uVar41) != '\0') {
                      piVar19 = (int *)(lVar22 + 8 + uVar41 * 4);
                      *piVar19 = *piVar19 + 1;
                      uVar21 = *(uint *)(lVar25 + 8 + uVar41 * 4);
                      goto LAB_001d4cf1;
                    }
                  }
                }
                else {
                  lVar24 = *local_208;
                  lVar22 = lVar24 * lVar13 + local_240;
                  piVar19 = (int *)(lVar22 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar31 = *(long *)local_2b8._80_8_;
                  lVar25 = lVar31 * lVar13 + local_2b8._24_8_;
                  uVar23 = *(uint *)(lVar25 + lVar39 * 4);
                  piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar31 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                  if ((1 < iVar37) &&
                     (piVar19 = (int *)(lVar27 + (ulong)(iVar37 - 1) * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar15 + (ulong)(iVar37 - 1)) != '\0')) {
                    piVar19 = (int *)(lVar22 + (ulong)(iVar37 - 2) * 4);
                    *piVar19 = *piVar19 + 1;
                    uVar21 = *(uint *)(lVar25 + (ulong)(iVar37 - 2) * 4);
                    goto LAB_001d4cf1;
                  }
                }
              }
              else {
                lVar24 = *local_208;
                lVar22 = lVar24 * lVar13 + local_240;
                piVar19 = (int *)(lVar22 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                lVar31 = *(long *)local_2b8._80_8_;
                lVar25 = lVar31 * lVar13 + local_2b8._24_8_;
                uVar23 = *(uint *)(lVar25 + lVar39 * 4);
                piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(lVar31 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                piVar19 = (int *)(lVar27 + 4 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                if (*(char *)(lVar15 + 1 + lVar39) == '\0') {
LAB_001d4cd5:
                  if ((iVar37 + 2 < iVar3) &&
                     (piVar19 = (int *)(lVar27 + 8 + lVar39 * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar15 + 2 + lVar39) != '\0')) {
                    piVar19 = (int *)(lVar22 + 8 + lVar39 * 4);
                    *piVar19 = *piVar19 + 1;
                    uVar21 = *(uint *)(lVar25 + 8 + lVar39 * 4);
LAB_001d4cf1:
                    UFPC::MemMerge(uVar23,uVar21);
                  }
                }
              }
              bVar44 = true;
            }
            else {
              lVar27 = local_160 + lVar15 * lVar30;
              piVar19 = (int *)(lVar27 + lVar39 * 4);
              *piVar19 = *piVar19 + 1;
              lVar15 = local_1d8._24_8_ + lVar24 * lVar30;
              if (*(char *)(lVar39 + lVar15) == '\0') {
                if ((iVar37 < 2) ||
                   (piVar19 = (int *)(lVar27 + (ulong)(iVar37 - 1) * 4), *piVar19 = *piVar19 + 1,
                   *(char *)(lVar15 + (ulong)(iVar37 - 1)) == '\0')) {
                  if ((iVar3 <= (int)uVar21) ||
                     (piVar19 = (int *)(lVar27 + 4 + lVar39 * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar15 + 1 + lVar39) == '\0')) {
                    uVar23 = UFPC::length_;
                    lVar15 = (long)(int)UFPC::length_;
                    UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15] =
                         UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar15] + 1;
                    UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15] = uVar23;
                    uVar23 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                    piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar39 * 4);
                    *piVar19 = *piVar19 + 1;
                    lVar15 = *(long *)local_2b8._80_8_;
                    goto LAB_001d4b78;
                  }
                  lVar15 = *local_208;
                  piVar19 = (int *)(lVar15 * lVar13 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar24 = *(long *)local_2b8._80_8_;
                  uVar23 = *(uint *)(lVar24 * lVar13 + local_2b8._24_8_ + lVar39 * 4);
                  piVar19 = (int *)(lVar15 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar24 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                }
                else {
                  lVar24 = *local_208;
                  lVar22 = lVar24 * lVar13 + local_240;
                  piVar19 = (int *)(lVar22 + (ulong)(iVar37 - 2) * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar31 = *(long *)local_2b8._80_8_;
                  lVar25 = lVar31 * lVar13 + local_2b8._24_8_;
                  uVar23 = *(uint *)(lVar25 + (ulong)(iVar37 - 2) * 4);
                  piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar31 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                  if (iVar3 <= (int)uVar21) goto LAB_001d4c54;
                  piVar19 = (int *)(lVar27 + (ulong)uVar21 * 4);
                  *piVar19 = *piVar19 + 1;
                  if (*(char *)(lVar15 + (ulong)uVar21) != '\0') {
                    piVar19 = (int *)(lVar22 + lVar39 * 4);
                    *piVar19 = *piVar19 + 1;
                    UFPC::MemMerge(uVar23,*(uint *)(lVar25 + lVar39 * 4));
                  }
                }
              }
              else {
                lVar24 = *local_208;
                piVar19 = (int *)(lVar24 * lVar13 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
                lVar15 = *(long *)local_2b8._80_8_;
                uVar23 = *(uint *)(lVar15 * lVar13 + local_2b8._24_8_ + lVar39 * 4);
                piVar19 = (int *)(lVar24 * uVar33 + local_240 + lVar39 * 4);
                *piVar19 = *piVar19 + 1;
LAB_001d4b78:
                *(uint *)(lVar15 * uVar33 + local_2b8._24_8_ + lVar39 * 4) = uVar23;
                if (iVar3 <= (int)uVar21) goto LAB_001d4c54;
              }
              if (uVar20 <= uVar14) goto LAB_001d4c54;
              piVar19 = (int *)(*local_128 * uVar14 + local_160 + 4 + lVar39 * 4);
              *piVar19 = *piVar19 + 1;
              bVar44 = *(char *)(lVar39 + 1 + *(long *)local_1d8._80_8_ * uVar14 + local_1d8._24_8_)
                       != '\0';
            }
LAB_001d4f01:
            uVar21 = iVar37 + 2;
            uVar41 = (ulong)uVar21;
            if ((bVar44) && ((int)uVar21 < iVar3)) {
              lVar31 = (long)(int)uVar21;
              lVar15 = lVar31 * 4;
              lVar27 = 0;
              lVar24 = 0;
              do {
                uVar41 = lVar31 + lVar24;
                lVar39 = *local_128;
                lVar26 = lVar39 * uVar33 + local_160;
                piVar19 = (int *)(lVar26 + lVar15 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                lVar22 = *(long *)local_1d8._80_8_;
                lVar25 = lVar22 * uVar33 + local_1d8._24_8_;
                uVar16 = (uVar38 & 0xffffffff) + 3 + lVar24;
                iVar12 = (int)uVar16;
                iVar18 = (int)lVar24;
                if (*(char *)(uVar41 + lVar25) != '\0') {
                  uVar28 = (uVar38 & 0xffffffff) + lVar24;
                  lVar43 = *local_208;
                  lVar35 = lVar15 + local_240;
                  lVar29 = uVar33 * lVar43 + lVar35;
                  piVar19 = (int *)(lVar29 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar36 = *(long *)local_2b8._80_8_;
                  lVar32 = lVar15 + local_2b8._24_8_;
                  lVar34 = uVar33 * lVar36 + lVar32;
                  *(uint *)(lVar34 + lVar24 * 4) = uVar23;
                  iVar11 = (int)uVar28;
                  if (iVar12 < iVar3) {
                    lVar40 = (long)iVar12;
                    piVar19 = (int *)(lVar26 + lVar40 * 4);
                    *piVar19 = *piVar19 + 1;
                    if (*(char *)(lVar25 + lVar40) != '\0') {
                      lVar25 = lVar39 * lVar30 + local_160;
                      piVar19 = (int *)(local_160 + lVar15 + local_2c8 * lVar39 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      lVar39 = lVar22 * lVar30 + local_1d8._24_8_;
                      cVar2 = *(char *)(lVar24 + local_1d8._24_8_ + lVar31 + local_2c8 * lVar22);
                      piVar19 = (int *)(lVar25 + lVar40 * 4);
                      *piVar19 = *piVar19 + 1;
                      if (cVar2 == '\0') {
                        if (*(char *)(lVar40 + lVar39) == '\0') {
                          if ((iVar11 < 0) ||
                             (uVar41 = (ulong)(iVar37 + iVar18 + 1),
                             piVar19 = (int *)(lVar25 + uVar41 * 4), *piVar19 = *piVar19 + 1,
                             *(char *)(lVar39 + uVar41) == '\0')) {
                            iVar18 = iVar37 + iVar18 + 4;
                            if (iVar18 < iVar3) {
                              lVar22 = (long)iVar18;
                              piVar19 = (int *)(lVar25 + lVar22 * 4);
                              *piVar19 = *piVar19 + 1;
                              if (*(char *)(lVar39 + lVar22) != '\0') {
                                piVar19 = (int *)(local_240 + lVar43 * lVar13 + lVar22 * 4);
                                *piVar19 = *piVar19 + 1;
                                uVar21 = *(uint *)(local_2b8._24_8_ + lVar36 * lVar13 + lVar22 * 4);
                                goto LAB_001d5b0d;
                              }
                            }
                            goto LAB_001d5b16;
                          }
                          uVar21 = iVar37 + iVar18 + 4;
                          if ((int)uVar21 < iVar3) {
                            uVar41 = (ulong)uVar21;
                            piVar19 = (int *)(lVar25 + uVar41 * 4);
                            *piVar19 = *piVar19 + 1;
                            if (*(char *)(lVar39 + uVar41) == '\0') goto LAB_001d5a24;
                            lVar22 = local_240 + lVar43 * lVar13;
                            lVar39 = (uVar28 & 0xffffffff) * 4;
                            piVar19 = (int *)(lVar39 + lVar22);
                            *piVar19 = *piVar19 + 1;
                            lVar25 = local_2b8._24_8_ + lVar36 * lVar13;
                            uVar21 = *(uint *)(lVar39 + lVar25);
                            piVar19 = (int *)(lVar22 + uVar41 * 4);
                            *piVar19 = *piVar19 + 1;
                            uVar21 = UFPC::MemMerge(uVar21,*(uint *)(lVar25 + uVar41 * 4));
                          }
                          else {
LAB_001d5a24:
                            lVar39 = (uVar28 & 0xffffffff) * 4;
                            piVar19 = (int *)(lVar39 + local_240 + lVar43 * lVar13);
                            *piVar19 = *piVar19 + 1;
                            uVar21 = *(uint *)(lVar39 + local_2b8._24_8_ + lVar36 * lVar13);
                          }
LAB_001d5b0d:
                          UFPC::MemMerge(uVar23,uVar21);
                        }
                        else {
                          if ((iVar11 < 0) ||
                             (uVar41 = (ulong)(iVar37 + iVar18 + 1),
                             piVar19 = (int *)(lVar25 + uVar41 * 4), *piVar19 = *piVar19 + 1,
                             *(char *)(lVar39 + uVar41) == '\0')) goto LAB_001d56af;
                          lVar39 = (uVar28 & 0xffffffff) * 4;
                          piVar19 = (int *)(lVar39 + local_240 + lVar43 * lVar13);
                          *piVar19 = *piVar19 + 1;
                          uVar21 = *(uint *)(lVar39 + local_2b8._24_8_ + lVar36 * lVar13);
                          piVar19 = (int *)(lVar35 + local_308 * lVar43 + lVar24 * 4);
                          *piVar19 = *piVar19 + 1;
                          j = *(uint *)(lVar32 + local_308 * lVar36 + lVar24 * 4);
LAB_001d56a1:
                          uVar21 = UFPC::MemMerge(uVar21,j);
LAB_001d56dd:
                          UFPC::MemMerge(uVar23,uVar21);
                        }
                      }
                      else {
                        if (*(char *)(lVar40 + lVar39) == '\0') {
                          iVar18 = iVar37 + iVar18 + 4;
                          if (iVar18 < iVar3) {
                            lVar22 = (long)iVar18;
                            piVar19 = (int *)(lVar25 + lVar22 * 4);
                            *piVar19 = *piVar19 + 1;
                            if (*(char *)(lVar39 + lVar22) != '\0') {
                              piVar19 = (int *)(lVar35 + local_308 * lVar43 + lVar24 * 4);
                              *piVar19 = *piVar19 + 1;
                              uVar21 = *(uint *)(lVar32 + local_308 * lVar36 + lVar24 * 4);
                              piVar19 = (int *)(local_240 + lVar43 * lVar13 + lVar22 * 4);
                              *piVar19 = *piVar19 + 1;
                              j = *(uint *)(local_2b8._24_8_ + lVar36 * lVar13 + lVar22 * 4);
                              goto LAB_001d56a1;
                            }
                          }
LAB_001d56af:
                          piVar19 = (int *)(lVar35 + lVar43 * local_308 + lVar24 * 4);
                          *piVar19 = *piVar19 + 1;
                          uVar21 = *(uint *)(lVar32 + lVar36 * local_308 + lVar24 * 4);
                          goto LAB_001d56dd;
                        }
                        piVar19 = (int *)(lVar35 + lVar43 * local_308 + lVar24 * 4);
                        *piVar19 = *piVar19 + 1;
                        UFPC::MemMerge(uVar23,*(uint *)(lVar32 + lVar36 * local_308 + lVar24 * 4));
                      }
                      goto LAB_001d5b16;
                    }
                  }
                  piVar19 = (int *)(lVar29 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(lVar34 + lVar24 * 4) = uVar23;
                  piVar19 = (int *)(local_2c8 * lVar39 + lVar15 + local_160 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  if (*(char *)(lVar24 + local_2c8 * lVar22 + local_1d8._24_8_ + lVar31) == '\0') {
                    lVar39 = local_160 + lVar39 * lVar30;
                    lVar22 = local_1d8._24_8_ + lVar22 * lVar30;
                    if ((iVar11 < 0) ||
                       (uVar41 = (ulong)(iVar37 + iVar18 + 1),
                       piVar19 = (int *)(lVar39 + uVar41 * 4), *piVar19 = *piVar19 + 1,
                       *(char *)(lVar22 + uVar41) == '\0')) {
                      if (iVar3 <= iVar12) goto LAB_001d5bc1;
                      piVar19 = (int *)(lVar39 + (long)iVar12 * 4);
                      *piVar19 = *piVar19 + 1;
                      if (*(char *)(lVar22 + iVar12) != '\0') {
                        piVar19 = (int *)(lVar35 + lVar43 * local_308 + lVar24 * 4);
                        *piVar19 = *piVar19 + 1;
                        uVar21 = *(uint *)(lVar32 + lVar36 * local_308 + lVar24 * 4);
                        goto LAB_001d5423;
                      }
                    }
                    else {
                      if ((iVar3 <= iVar12) ||
                         (uVar16 = uVar16 & 0xffffffff, piVar19 = (int *)(lVar39 + uVar16 * 4),
                         *piVar19 = *piVar19 + 1, *(char *)(lVar22 + uVar16) == '\0')) {
                        uVar41 = uVar28 & 0xffffffff;
                        piVar19 = (int *)(local_240 + lVar43 * lVar13 + uVar41 * 4);
                        goto LAB_001d512c;
                      }
                      lVar39 = (uVar28 & 0xffffffff) * 4;
                      piVar19 = (int *)(lVar39 + local_240 + lVar43 * lVar13);
                      *piVar19 = *piVar19 + 1;
                      uVar21 = *(uint *)(lVar39 + local_2b8._24_8_ + lVar36 * lVar13);
                      piVar19 = (int *)(lVar35 + local_308 * lVar43 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      uVar21 = UFPC::MemMerge(uVar21,*(uint *)(lVar32 + local_308 * lVar36 +
                                                              lVar24 * 4));
LAB_001d5423:
                      UFPC::MemMerge(uVar23,uVar21);
                    }
LAB_001d5431:
                    if ((uVar14 < uVar20) &&
                       (piVar19 = (int *)(*local_128 * uVar14 + local_160 + (long)iVar12 * 4),
                       *piVar19 = *piVar19 + 1,
                       *(char *)((long)iVar12 +
                                *(long *)local_1d8._80_8_ * uVar14 + local_1d8._24_8_) != '\0'))
                    goto LAB_001d5b16;
                  }
                  else {
                    piVar19 = (int *)(lVar35 + lVar27 + lVar43 * local_308);
LAB_001d512c:
                    *piVar19 = *piVar19 + 1;
                    UFPC::MemMerge(uVar23,*(uint *)(local_2b8._24_8_ + lVar36 * lVar13 + uVar41 * 4)
                                  );
                    if (iVar12 < iVar3) goto LAB_001d5431;
                  }
LAB_001d5bc1:
                  uVar41 = lVar31 + lVar24 + 2;
                  goto LAB_001d5bcd;
                }
                if (iVar12 < iVar3) {
                  lVar43 = (long)iVar12;
                  piVar19 = (int *)(lVar26 + lVar43 * 4);
                  *piVar19 = *piVar19 + 1;
                  if (*(char *)(lVar25 + lVar43) == '\0') goto LAB_001d526e;
                  if (uVar14 < uVar20) {
                    piVar19 = (int *)(local_1f0 * lVar39 + local_160 + lVar15 + lVar24 * 4);
                    *piVar19 = *piVar19 + 1;
                    if (*(char *)(lVar24 + local_1f0 * lVar22 + local_1d8._24_8_ + lVar31) != '\0')
                    {
                      lVar26 = *local_208;
                      lVar25 = local_240 + lVar15;
                      piVar19 = (int *)(uVar33 * lVar26 + lVar25 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      lVar36 = *(long *)local_2b8._80_8_;
                      lVar32 = lVar15 + local_2b8._24_8_;
                      *(uint *)(uVar33 * lVar36 + lVar32 + lVar24 * 4) = uVar23;
                      lVar29 = local_160 + lVar39 * lVar30;
                      piVar19 = (int *)(lVar29 + lVar43 * 4);
                      *piVar19 = *piVar19 + 1;
                      lVar34 = local_1d8._24_8_ + lVar22 * lVar30;
                      if (*(char *)(lVar43 + lVar34) == '\0') {
                        piVar19 = (int *)(local_160 + lVar15 + lVar39 * local_2c8 + lVar24 * 4);
                        *piVar19 = *piVar19 + 1;
                        if (*(char *)(lVar24 + local_1d8._24_8_ + lVar31 + lVar22 * local_2c8) !=
                            '\0') {
                          iVar12 = iVar37 + iVar18 + 4;
                          if (iVar12 < iVar3) {
                            lVar39 = (long)iVar12;
                            piVar19 = (int *)(lVar29 + lVar39 * 4);
                            *piVar19 = *piVar19 + 1;
                            if (*(char *)(lVar34 + lVar39) != '\0') {
                              piVar19 = (int *)(lVar25 + local_308 * lVar26 + lVar24 * 4);
                              *piVar19 = *piVar19 + 1;
                              uVar21 = *(uint *)(lVar32 + local_308 * lVar36 + lVar24 * 4);
                              piVar19 = (int *)(local_240 + lVar26 * lVar13 + lVar39 * 4);
                              *piVar19 = *piVar19 + 1;
                              uVar21 = UFPC::MemMerge(uVar21,*(uint *)(local_2b8._24_8_ +
                                                                       lVar36 * lVar13 + lVar39 * 4)
                                                     );
                              goto LAB_001d5a72;
                            }
                          }
                          piVar19 = (int *)(lVar25 + lVar26 * local_308 + lVar24 * 4);
                          *piVar19 = *piVar19 + 1;
                          uVar21 = *(uint *)(lVar32 + lVar36 * local_308 + lVar24 * 4);
                          goto LAB_001d5a72;
                        }
                      }
                      else {
                        piVar19 = (int *)(lVar25 + lVar26 * local_308 + lVar24 * 4);
                        *piVar19 = *piVar19 + 1;
                        uVar21 = *(uint *)(lVar32 + lVar36 * local_308 + lVar24 * 4);
LAB_001d5a72:
                        UFPC::MemMerge(uVar23,uVar21);
                      }
                      iVar18 = iVar37 + iVar18 + 4;
                      if (iVar18 < iVar3) {
                        lVar39 = (long)iVar18;
                        piVar19 = (int *)(*local_128 * lVar30 + local_160 + lVar39 * 4);
                        *piVar19 = *piVar19 + 1;
                        if (*(char *)(lVar39 + *(long *)local_1d8._80_8_ * lVar30 + local_1d8._24_8_
                                     ) != '\0') {
                          piVar19 = (int *)(*local_208 * lVar13 + local_240 + lVar39 * 4);
                          *piVar19 = *piVar19 + 1;
                          uVar21 = *(uint *)(*(long *)local_2b8._80_8_ * lVar13 + local_2b8._24_8_ +
                                            lVar39 * 4);
                          goto LAB_001d5b0d;
                        }
                      }
                      goto LAB_001d5b16;
                    }
                  }
                  lVar26 = lVar39 * lVar30 + local_160;
                  piVar19 = (int *)(lVar26 + lVar43 * 4);
                  *piVar19 = *piVar19 + 1;
                  lVar25 = lVar22 * lVar30 + local_1d8._24_8_;
                  if (*(char *)(lVar43 + lVar25) == '\0') {
                    piVar19 = (int *)(local_160 + lVar15 + lVar39 * local_2c8 + lVar24 * 4);
                    *piVar19 = *piVar19 + 1;
                    if (*(char *)(lVar24 + local_1d8._24_8_ + lVar31 + lVar22 * local_2c8) == '\0')
                    {
                      iVar18 = iVar37 + iVar18 + 4;
                      if (iVar18 < iVar3) {
                        lVar39 = (long)iVar18;
                        piVar19 = (int *)(lVar26 + lVar39 * 4);
                        *piVar19 = *piVar19 + 1;
                        if (*(char *)(lVar25 + lVar39) != '\0') {
                          lVar22 = *local_208;
                          piVar19 = (int *)(lVar22 * lVar13 + local_240 + lVar39 * 4);
                          *piVar19 = *piVar19 + 1;
                          lVar25 = *(long *)local_2b8._80_8_;
                          uVar23 = *(uint *)(lVar25 * lVar13 + local_2b8._24_8_ + lVar39 * 4);
                          piVar19 = (int *)(local_240 + lVar15 + lVar22 * uVar33 + lVar24 * 4);
                          *piVar19 = *piVar19 + 1;
                          *(uint *)(local_2b8._24_8_ + lVar15 + lVar25 * uVar33 + lVar24 * 4) =
                               uVar23;
                          goto LAB_001d5b16;
                        }
                      }
                      uVar21 = UFPC::length_;
                      lVar39 = (long)(int)UFPC::length_;
                      UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar39] =
                           UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar39] + 1;
                      UFPC::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar39] = uVar21;
                      uVar23 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                      piVar19 = (int *)(local_240 + lVar15 + *local_208 * uVar33 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      *(uint *)(local_2b8._24_8_ + lVar15 + *(long *)local_2b8._80_8_ * uVar33 +
                               lVar24 * 4) = uVar23;
                    }
                    else {
                      lVar39 = *local_208;
                      piVar19 = (int *)(local_308 * lVar39 + local_240 + lVar15 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      lVar22 = *(long *)local_2b8._80_8_;
                      uVar23 = *(uint *)(local_308 * lVar22 + lVar15 + local_2b8._24_8_ + lVar24 * 4
                                        );
                      piVar19 = (int *)(uVar33 * lVar39 + local_240 + lVar15 + lVar24 * 4);
                      *piVar19 = *piVar19 + 1;
                      *(uint *)(uVar33 * lVar22 + lVar15 + local_2b8._24_8_ + lVar24 * 4) = uVar23;
                      iVar18 = iVar37 + iVar18 + 4;
                      if (iVar18 < iVar3) {
                        lVar43 = (long)iVar18;
                        piVar19 = (int *)(lVar26 + lVar43 * 4);
                        *piVar19 = *piVar19 + 1;
                        if (*(char *)(lVar25 + lVar43) != '\0') {
                          piVar19 = (int *)(local_240 + lVar39 * lVar13 + lVar43 * 4);
                          *piVar19 = *piVar19 + 1;
                          uVar21 = *(uint *)(local_2b8._24_8_ + lVar22 * lVar13 + lVar43 * 4);
                          goto LAB_001d5b0d;
                        }
                      }
                    }
                  }
                  else {
                    lVar39 = *local_208;
                    piVar19 = (int *)(local_308 * lVar39 + local_240 + lVar15 + lVar24 * 4);
                    *piVar19 = *piVar19 + 1;
                    lVar22 = *(long *)local_2b8._80_8_;
                    uVar23 = *(uint *)(local_308 * lVar22 + local_2b8._24_8_ + lVar15 + lVar24 * 4);
                    piVar19 = (int *)(lVar39 * uVar33 + local_240 + lVar15 + lVar24 * 4);
                    *piVar19 = *piVar19 + 1;
                    *(uint *)(lVar22 * uVar33 + local_2b8._24_8_ + lVar15 + lVar24 * 4) = uVar23;
                  }
                  goto LAB_001d5b16;
                }
LAB_001d526e:
                if (uVar20 <= uVar14) goto LAB_001d5bc1;
                lVar25 = lVar39 * uVar14 + local_160;
                piVar19 = (int *)(local_160 + lVar15 + local_1f0 * lVar39 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                lVar39 = lVar22 * uVar14 + local_1d8._24_8_;
                if (*(char *)(lVar24 + local_1d8._24_8_ + lVar31 + local_1f0 * lVar22) == '\0') {
                  if ((iVar3 <= iVar12) ||
                     (piVar19 = (int *)(lVar25 + (long)iVar12 * 4), *piVar19 = *piVar19 + 1,
                     uVar21 = UFPC::length_, *(char *)(lVar39 + iVar12) == '\0')) goto LAB_001d5bc1;
                  lVar39 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar39] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar39] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar39] = uVar21;
                  uVar23 = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar15 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(*(long *)local_2b8._80_8_ * uVar33 + local_2b8._24_8_ + lVar15 +
                           lVar24 * 4) = uVar23;
                }
                else {
                  piVar19 = (int *)(*local_208 * uVar33 + local_240 + lVar15 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(*(long *)local_2b8._80_8_ * uVar33 + local_2b8._24_8_ + lVar15 +
                           lVar24 * 4) = uVar23;
                  if ((iVar3 <= iVar12) ||
                     (piVar19 = (int *)(lVar25 + (long)iVar12 * 4), *piVar19 = *piVar19 + 1,
                     *(char *)(lVar39 + iVar12) == '\0')) goto LAB_001d5bc1;
                }
LAB_001d5b16:
                lVar39 = lVar31 + lVar24;
                lVar24 = lVar24 + 2;
                lVar27 = lVar27 + 8;
              } while (lVar39 + 2 < lVar42);
              uVar41 = lVar31 + lVar24;
            }
          }
LAB_001d5bcd:
          uVar38 = uVar41;
        } while ((int)uVar41 < iVar3);
      }
      uVar33 = uVar33 + 2;
      local_1f0 = local_1f0 + 2;
      local_2c8 = local_2c8 + 2;
      local_308 = local_308 + 2;
    } while (uVar33 < uVar20);
  }
  uVar21 = UFPC::MemFlatten();
  (local_1e8->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar21;
  if (0 < (int)uVar4) {
    lVar30 = 1;
    local_338 = 0;
    do {
      piVar9 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar3) {
        uVar33 = local_338 | 1;
        lVar13 = *local_208;
        lVar15 = *(long *)local_2b8._80_8_;
        lVar24 = 1;
        do {
          piVar19 = (int *)(lVar13 * local_338 + local_240 + -4 + lVar24 * 4);
          *piVar19 = *piVar19 + 1;
          lVar27 = (long)*(int *)(lVar15 * local_338 + local_2b8._24_8_ + -4 + lVar24 * 4);
          if (lVar27 < 1) {
            lVar27 = *local_208;
            lVar39 = local_338 * lVar27 + local_240;
            piVar19 = (int *)(lVar39 + -4 + lVar24 * 4);
            *piVar19 = *piVar19 + 1;
            lVar31 = *(long *)local_2b8._80_8_;
            lVar22 = local_338 * lVar31 + local_2b8._24_8_;
            *(undefined4 *)(lVar22 + -4 + lVar24 * 4) = 0;
            if (lVar24 < lVar42) {
              piVar19 = (int *)(lVar39 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              *(undefined4 *)(lVar22 + lVar24 * 4) = 0;
              if (uVar33 < uVar20) {
                lVar27 = lVar27 * lVar30 + local_240;
                piVar19 = (int *)(lVar27 + -4 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                lVar31 = lVar31 * lVar30 + local_2b8._24_8_;
                *(undefined4 *)(lVar31 + -4 + lVar24 * 4) = 0;
                piVar19 = (int *)(lVar27 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                *(undefined4 *)(lVar31 + lVar24 * 4) = 0;
              }
            }
            else if (uVar33 < uVar20) {
              piVar19 = (int *)(lVar27 * lVar30 + local_240 + -4 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              *(undefined4 *)(lVar31 * lVar30 + local_2b8._24_8_ + -4 + lVar24 * 4) = 0;
            }
          }
          else {
            piVar9[lVar27] = piVar9[lVar27] + 1;
            uVar4 = puVar8[lVar27];
            lVar27 = *local_128;
            lVar26 = local_338 * lVar27 + local_160;
            piVar19 = (int *)(lVar26 + -4 + lVar24 * 4);
            *piVar19 = *piVar19 + 1;
            lVar31 = *(long *)local_1d8._80_8_;
            lVar22 = local_338 * lVar31 + local_1d8._24_8_;
            lVar39 = *local_208;
            lVar25 = local_338 * lVar39 + local_240;
            uVar21 = uVar4;
            if (*(char *)(lVar24 + -1 + lVar22) == '\0') {
              uVar21 = 0;
            }
            piVar19 = (int *)(lVar25 + -4 + lVar24 * 4);
            *piVar19 = *piVar19 + 1;
            lVar43 = *(long *)local_2b8._80_8_;
            lVar36 = local_338 * lVar43 + local_2b8._24_8_;
            *(uint *)(lVar36 + -4 + lVar24 * 4) = uVar21;
            if (lVar24 < lVar42) {
              piVar19 = (int *)(lVar26 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              uVar21 = uVar4;
              if (*(char *)(lVar24 + lVar22) == '\0') {
                uVar21 = 0;
              }
              piVar19 = (int *)(lVar25 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              *(uint *)(lVar36 + lVar24 * 4) = uVar21;
              if (uVar33 < uVar20) {
                piVar19 = (int *)(lVar27 * lVar30 + local_160 + -4 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                uVar21 = uVar4;
                if (*(char *)(lVar24 + -1 + lVar31 * lVar30 + local_1d8._24_8_) == '\0') {
                  lVar39 = *local_208;
                  uVar21 = 0;
                }
                piVar19 = (int *)(lVar39 * lVar30 + local_240 + -4 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                *(uint *)(*(long *)local_2b8._80_8_ * lVar30 + local_2b8._24_8_ + -4 + lVar24 * 4) =
                     uVar21;
                piVar19 = (int *)(*local_128 * lVar30 + local_160 + lVar24 * 4);
                *piVar19 = *piVar19 + 1;
                if (*(char *)(lVar24 + *(long *)local_1d8._80_8_ * lVar30 + local_1d8._24_8_) ==
                    '\0') {
                  piVar19 = (int *)(*local_208 * lVar30 + local_240 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(undefined4 *)
                   (*(long *)local_2b8._80_8_ * lVar30 + local_2b8._24_8_ + lVar24 * 4) = 0;
                }
                else {
                  piVar19 = (int *)(*local_208 * lVar30 + local_240 + lVar24 * 4);
                  *piVar19 = *piVar19 + 1;
                  *(uint *)(*(long *)local_2b8._80_8_ * lVar30 + local_2b8._24_8_ + lVar24 * 4) =
                       uVar4;
                }
              }
            }
            else if (uVar33 < uVar20) {
              piVar19 = (int *)(lVar27 * lVar30 + local_160 + -4 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              cVar2 = *(char *)(lVar24 + -1 + lVar31 * lVar30 + local_1d8._24_8_);
              piVar19 = (int *)(lVar39 * lVar30 + local_240 + -4 + lVar24 * 4);
              *piVar19 = *piVar19 + 1;
              lVar27 = lVar43 * lVar30 + local_2b8._24_8_;
              if (cVar2 == '\0') {
                *(undefined4 *)(lVar27 + -4 + lVar24 * 4) = 0;
              }
              else {
                *(uint *)(lVar27 + -4 + lVar24 * 4) = uVar4;
              }
            }
          }
          lVar27 = lVar24 + 1;
          lVar24 = lVar24 + 2;
        } while (lVar27 < lVar42);
      }
      local_338 = local_338 + 2;
      lVar30 = lVar30 + 2;
    } while (local_338 < uVar20);
  }
  pauVar17 = (undefined1 (*) [16])operator_new(0x20);
  pvVar10 = local_1e0;
  pauVar17[1] = (undefined1  [16])0x0;
  *pauVar17 = (undefined1  [16])0x0;
  puVar6 = (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar17;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar17 + 2);
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar17 + 2);
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar7 - (long)puVar6);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_170;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_250;
  cv::sum((_InputArray *)&local_f0);
  puVar6 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6[1] = (long)((double)local_f0._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_f0._0_8_ >> 0x3f | (long)(double)local_f0._0_8_;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar20 = 0;
  }
  else {
    lVar42 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar45 = 0.0;
    lVar30 = 0;
    do {
      dVar45 = dVar45 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar42 + (ulong)(lVar42 == 0) != lVar30);
    uVar20 = (long)(dVar45 - 9.223372036854776e+18) & (long)dVar45 >> 0x3f | (long)dVar45;
  }
  puVar6[2] = uVar20;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2b8);
  cv::Mat::operator=(&((local_1e8->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat((Mat *)(local_2b8 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }